

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O0

void __thiscall xLearn::Trainer::CVTrain(Trainer *this)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  string *psVar4;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_RDI;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> te_reader;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_00000048;
  int j;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> tr_reader;
  int i;
  string *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *this_00;
  int local_5c;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> local_30;
  int local_c;
  
  for (local_c = 0; uVar2 = (ulong)local_c,
      sVar3 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::size(in_RDI),
      uVar2 < sVar3; local_c = local_c + 1) {
    uVar1 = local_c + 1;
    sVar3 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::size(in_RDI);
    this_00 = &local_30;
    StringPrintf_abi_cxx11_((char *)this_00,"Cross-validation: %d/%lu:",(ulong)uVar1,sVar3);
    Color::print_action(in_stack_ffffffffffffff60);
    std::__cxx11::string::~string((string *)&local_30);
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::vector
              ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)0x1f7db5);
    local_5c = 0;
    while( true ) {
      in_stack_ffffffffffffff60 = (string *)(long)local_5c;
      psVar4 = (string *)
               std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::size(in_RDI);
      if (psVar4 <= in_stack_ffffffffffffff60) break;
      if (local_c != local_5c) {
        std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                  (in_RDI,(long)local_5c);
        std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::push_back
                  (this_00,(value_type *)CONCAT44(uVar1,in_stack_ffffffffffffff68));
      }
      local_5c = local_5c + 1;
    }
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::vector
              ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)0x1f7e58);
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
              (in_RDI,(long)local_c);
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::push_back
              (this_00,(value_type *)CONCAT44(uVar1,in_stack_ffffffffffffff68));
    if (local_c != 0) {
      Model::Reset((Model *)0x1f7e90);
    }
    train((Trainer *)
          tr_reader.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
          super__Vector_impl_data._M_start,in_stack_00000048,
          (vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
          te_reader.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage);
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~vector(this_00);
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~vector(this_00);
  }
  show_average_metric((Trainer *)
                      te_reader.
                      super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Trainer::CVTrain() {
  // Use the i-th reader as validation Reader
  for (int i = 0; i < reader_list_.size(); ++i) {
    Color::print_action(
      StringPrintf("Cross-validation: %d/%lu:", 
        i+1, reader_list_.size())
    );
    // Get the train Reader and test Reader
    std::vector<Reader*> tr_reader;
    for (int j = 0; j < reader_list_.size(); ++j) {
      if (i == j) { continue; }
      tr_reader.push_back(reader_list_[j]);
    }
    std::vector<Reader*> te_reader;
    te_reader.push_back(reader_list_[i]);
    if (i != 0) {
      // Re-init current model parameters.
      model_->Reset();
    }
    this->train(tr_reader, te_reader);
  }
  // Average metric for cross-validation
  show_average_metric();
}